

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::PatchableRootProperty
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint cacheId,bool isLoadMethod,bool isStore,
          bool registerCacheIdForCall)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  bool success;
  CacheIdUnit unit;
  bool registerCacheIdForCall_local;
  bool isStore_local;
  RegSlot RStack_18;
  bool isLoadMethod_local;
  uint cacheId_local;
  RegSlot value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  unit._5_1_ = registerCacheIdForCall;
  unit._6_1_ = isStore;
  unit._7_1_ = isLoadMethod;
  RStack_18 = value;
  cacheId_local._2_2_ = op;
  _value_local = this;
  CheckOpen(this);
  op_00 = cacheId_local._2_2_;
  OpLayoutType::OpLayoutType((OpLayoutType *)&unit,ElementRootCP);
  CheckOp(this,op_00,(OpLayoutType)unit.cacheId);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(cacheId_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x773,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (((unit._7_1_ & 1) != 0) && ((unit._6_1_ & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x774,"(!isLoadMethod || !isStore)","!isLoadMethod || !isStore");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  RStack_18 = ConsumeReg(this,RStack_18);
  if ((cacheId_local._2_2_ == InitRootLetFld) || (cacheId_local._2_2_ == InitRootConstFld))
  goto LAB_00c30c68;
  if (cacheId_local._2_2_ == LdRootFld) {
LAB_00c30a7a:
    bVar2 = DoDynamicProfileOpcode(this,AggressiveIntTypeSpecPhase,false);
    if (((bVar2) || (bVar2 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false), bVar2)) ||
       ((bVar2 = DoDynamicProfileOpcode(this,ObjTypeSpecPhase,false), bVar2 ||
        ((bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false), bVar2 ||
         (bVar2 = DoDynamicProfileOpcode(this,ProfileBasedFldFastPathPhase,false), bVar2)))))) {
      OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&cacheId_local + 2));
    }
  }
  else {
    if (cacheId_local._2_2_ == LdRootMethodFld) {
      if ((unit._5_1_ & 1) != 0) {
        CacheIdUnit::CacheIdUnit((CacheIdUnit *)&stack0xffffffffffffffd4,cacheId,true);
        bVar2 = JsUtil::
                BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::TryGetValue<unsigned_int>
                          (this->callRegToLdFldCacheIndexMap,&stack0xffffffffffffffe8,
                           (CacheIdUnit *)&stack0xffffffffffffffd4);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x789,
                                      "(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit))",
                                      "!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        JsUtil::
        BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Add(this->callRegToLdFldCacheIndexMap,&stack0xffffffffffffffe8,
              (CacheIdUnit *)&stack0xffffffffffffffd4);
      }
    }
    else if (((cacheId_local._2_2_ != StRootFld) && (cacheId_local._2_2_ != StRootFldStrict)) &&
            (cacheId_local._2_2_ != InitRootFld)) {
      if (cacheId_local._2_2_ != LdRootFldForTypeOf) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x79a,"(false)",
                                    "The specified OpCode is not intended for patchable root field-access"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
        goto LAB_00c30c68;
      }
      goto LAB_00c30a7a;
    }
    bVar2 = DoDynamicProfileOpcode(this,ProfileBasedFldFastPathPhase,false);
    if (((bVar2) || (bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false), bVar2)) ||
       (bVar2 = DoDynamicProfileOpcode(this,ObjTypeSpecPhase,false), bVar2)) {
      OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&cacheId_local + 2));
    }
  }
LAB_00c30c68:
  bVar2 = TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,cacheId_local._2_2_,RStack_18,cacheId,(bool)(unit._7_1_ & 1),
                     (bool)(unit._6_1_ & 1));
  if (((!bVar2) &&
      (bVar2 = TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,cacheId_local._2_2_,RStack_18,cacheId,(bool)(unit._7_1_ & 1),
                          (bool)(unit._6_1_ & 1)), !bVar2)) &&
     (bVar2 = TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,cacheId_local._2_2_,RStack_18,cacheId,(bool)(unit._7_1_ & 1),
                         (bool)(unit._6_1_ & 1)), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x79e,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::PatchableRootProperty(OpCode op, RegSlot value, uint cacheId, bool isLoadMethod, bool isStore, bool registerCacheIdForCall)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementRootCP);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        Assert(!isLoadMethod || !isStore);

        value = ConsumeReg(value);

        switch (op)
        {
        case OpCode::LdRootFld:
        case OpCode::LdRootFldForTypeOf:
            if (DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
                DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::LdRootMethodFld:
            if (registerCacheIdForCall)
            {
                CacheIdUnit unit(cacheId, true);
                Assert(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit));
                callRegToLdFldCacheIndexMap->Add(value, unit);
            }
        case OpCode::StRootFld:
        case OpCode::StRootFldStrict:
        case OpCode::InitRootFld:
            if (DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::InitRootLetFld:
        case OpCode::InitRootConstFld:
            break;
        default:
            AssertMsg(false, "The specified OpCode is not intended for patchable root field-access");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementRootCP, op, value, cacheId, isLoadMethod, isStore);
    }